

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void sve_st1_zd(CPUARMState_conflict *env,void *vd,void *vg,void *vm,target_ulong base,uint32_t desc
               ,uintptr_t ra,zreg_off_fn *off_fn,sve_ld1_tlb_fn *tlb_fn)

{
  uint32_t uVar1;
  uint32_t uVar2;
  intptr_t iVar3;
  target_ulong tVar4;
  target_ulong off;
  uint8_t pg;
  intptr_t oprsz;
  intptr_t i;
  int scale;
  TCGMemOpIdx oi;
  uint32_t desc_local;
  target_ulong base_local;
  void *vm_local;
  void *vg_local;
  void *vd_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = extract32(desc,10,8);
  uVar2 = extract32(desc,0x12,2);
  iVar3 = simd_oprsz(desc);
  set_helper_retaddr(ra);
  for (oprsz = 0; oprsz < iVar3 / 8; oprsz = oprsz + 1) {
    if ((*(byte *)((long)vg + oprsz) & 1) != 0) {
      tVar4 = (*off_fn)(vm,oprsz << 3);
      (*tlb_fn)(env,vd,oprsz << 3,base + (tVar4 << ((byte)uVar2 & 0x3f)),uVar1,ra);
    }
  }
  clear_helper_retaddr();
  return;
}

Assistant:

static void sve_st1_zd(CPUARMState *env, void *vd, void *vg, void *vm,
                       target_ulong base, uint32_t desc, uintptr_t ra,
                       zreg_off_fn *off_fn, sve_ld1_tlb_fn *tlb_fn)
{
    const TCGMemOpIdx oi = extract32(desc, SIMD_DATA_SHIFT, MEMOPIDX_SHIFT);
    const int scale = extract32(desc, SIMD_DATA_SHIFT + MEMOPIDX_SHIFT, 2);
    intptr_t i, oprsz = simd_oprsz(desc) / 8;

    set_helper_retaddr(ra);
    for (i = 0; i < oprsz; i++) {
        uint8_t pg = *(uint8_t *)((char *)vg + H1(i));
        if (likely(pg & 1)) {
            target_ulong off = off_fn(vm, i * 8);
            tlb_fn(env, vd, i * 8, base + (off << scale), oi, ra);
        }
    }
    clear_helper_retaddr();
}